

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O1

sunrealtype N_VMaxNormLocal_ManyVector(N_Vector x)

{
  long *plVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  plVar1 = (long *)x->content;
  if (*plVar1 < 1) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    lVar2 = 0;
    do {
      if (*(long *)(*(long *)(*(long *)(plVar1[2] + lVar2 * 8) + 8) + 0x148) == 0) {
        dVar4 = (double)N_VMaxNorm();
      }
      else {
        dVar4 = (double)N_VMaxNormLocal();
      }
      if (dVar3 <= dVar4) {
        dVar3 = dVar4;
      }
      lVar2 = lVar2 + 1;
      plVar1 = (long *)x->content;
    } while (lVar2 < *plVar1);
  }
  return dVar3;
}

Assistant:

sunrealtype MVAPPEND(N_VMaxNormLocal)(N_Vector x)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  sunrealtype max, lmax;

  /* initialize output*/
  max = ZERO;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* check for nvmaxnormlocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvmaxnormlocal)
    {
      lmax = N_VMaxNormLocal(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();
      max = (max > lmax) ? max : lmax;

      /* otherwise, call nvmaxnorm and accumulate to overall max */
    }
    else
    {
      lmax = N_VMaxNorm(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();
      max = (max > lmax) ? max : lmax;
    }
  }

  return (max);
}